

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

point_set * target_get_monsters(wchar_t mode,monster_predicate pred,_Bool restrict_to_panel)

{
  loc *base;
  _Bool _Var1;
  int iVar2;
  point_set *ps;
  loc_conflict grid_00;
  monster *m;
  monster *mon;
  loc grid;
  point_set *targets;
  wchar_t local_30;
  wchar_t max_x;
  wchar_t max_y;
  wchar_t min_x;
  wchar_t min_y;
  wchar_t x;
  wchar_t y;
  _Bool restrict_to_panel_local;
  monster_predicate pred_local;
  wchar_t mode_local;
  
  x._3_1_ = restrict_to_panel;
  _y = pred;
  pred_local._4_4_ = mode;
  ps = (point_set *)point_set_new(0x14);
  if ((x._3_1_ & 1) == 0) {
    max_y = (player->grid).y - (uint)z_info->max_range;
    local_30 = (player->grid).y + (uint)z_info->max_range + L'\x01';
    max_x = (player->grid).x - (uint)z_info->max_range;
    targets._4_4_ = (player->grid).x + (uint)z_info->max_range + L'\x01';
  }
  else {
    get_panel(&max_y,&max_x,&local_30,(int *)((long)&targets + 4));
  }
  for (min_y = max_y; min_y < local_30; min_y = min_y + L'\x01') {
    for (min_x = max_x; min_x < targets._4_4_; min_x = min_x + L'\x01') {
      grid_00 = (loc_conflict)loc(min_x,min_y);
      _Var1 = square_in_bounds_fully((chunk *)cave,grid_00);
      if (((_Var1) && (_Var1 = target_accept(min_y,min_x), _Var1)) &&
         (((pred_local._4_4_ & 1U) == 0 ||
          (((m = square_monster((chunk *)cave,grid_00), m != (monster *)0x0 &&
            (_Var1 = target_able(m), _Var1)) &&
           ((_y == (monster_predicate)0x0 || (_Var1 = (*_y)(m), _Var1)))))))) {
        add_to_point_set((point_set_conflict *)ps,(loc)grid_00);
      }
    }
  }
  base = ps->pts;
  iVar2 = point_set_size((point_set_conflict *)ps);
  sort(base,(long)iVar2,8,cmp_distance);
  return ps;
}

Assistant:

struct point_set *target_get_monsters(int mode, monster_predicate pred,
		bool restrict_to_panel)
{
	int y, x;
	int min_y, min_x, max_y, max_x;
	struct point_set *targets = point_set_new(TS_INITIAL_SIZE);

	if (restrict_to_panel) {
		/* Get the current panel */
		get_panel(&min_y, &min_x, &max_y, &max_x);
	} else {
		min_y = player->grid.y - z_info->max_range;
		max_y = player->grid.y + z_info->max_range + 1;
		min_x = player->grid.x - z_info->max_range;
		max_x = player->grid.x + z_info->max_range + 1;
	}

	/* Scan for targets */
	for (y = min_y; y < max_y; y++) {
		for (x = min_x; x < max_x; x++) {
			struct loc grid = loc(x, y);

			/* Check bounds */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Require "interesting" contents */
			if (!target_accept(y, x)) continue;

			/* Special mode */
			if (mode & (TARGET_KILL)) {
				struct monster *mon = square_monster(cave, grid);

				/* Must contain a monster */
				if (mon == NULL) continue;

				/* Must be a targettable monster */
				if (!target_able(mon)) continue;

				/* Must be the right sort of monster */
				if (pred && !pred(mon)) continue;
			}

			/* Save the location */
			add_to_point_set(targets, grid);
		}
	}

	sort(targets->pts, point_set_size(targets), sizeof(*(targets->pts)),
		 cmp_distance);
	return targets;
}